

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::CodeHolder::copyFlattenedData
          (CodeHolder *this,void *dst,size_t dstSize,CopySectionFlags copyFlags)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong __n;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __n_00;
  
  lVar2 = *(long *)&this->_sectionsByOrder;
  uVar1 = *(uint *)&this->field_0xf0;
  lVar6 = 0;
  uVar5 = 0;
  while( true ) {
    if ((ulong)uVar1 << 3 == lVar6) {
      if (((copyFlags & kPadTargetBuffer) != kNone) && (uVar5 <= dstSize && dstSize - uVar5 != 0)) {
        memset((void *)((long)dst + uVar5),0,dstSize - uVar5);
      }
      return 0;
    }
    lVar3 = *(long *)(lVar2 + lVar6);
    uVar7 = *(ulong *)(lVar3 + 0x10);
    uVar8 = dstSize - uVar7;
    if ((dstSize < uVar7) || (__n = *(ulong *)(lVar3 + 0x50), uVar8 < __n)) break;
    memcpy((void *)((long)dst + uVar7),*(void **)(lVar3 + 0x48),__n);
    if (((copyFlags & kPadSectionBuffer) == kNone) ||
       (uVar4 = *(ulong *)(lVar3 + 0x18), uVar4 <= __n)) {
      __n_00 = 0;
    }
    else {
      if (uVar4 < uVar8) {
        uVar8 = uVar4;
      }
      __n_00 = uVar8 - __n;
      memset((void *)((long)((long)dst + uVar7) + __n),0,__n_00);
    }
    uVar7 = __n + uVar7 + __n_00;
    if (uVar5 <= uVar7) {
      uVar5 = uVar7;
    }
    lVar6 = lVar6 + 8;
  }
  return 2;
}

Assistant:

Error CodeHolder::copyFlattenedData(void* dst, size_t dstSize, CopySectionFlags copyFlags) noexcept {
  size_t end = 0;
  for (Section* section : _sectionsByOrder) {
    if (section->offset() > dstSize)
      return DebugUtils::errored(kErrorInvalidArgument);

    size_t bufferSize = section->bufferSize();
    size_t offset = size_t(section->offset());

    if (ASMJIT_UNLIKELY(dstSize - offset < bufferSize))
      return DebugUtils::errored(kErrorInvalidArgument);

    uint8_t* dstTarget = static_cast<uint8_t*>(dst) + offset;
    size_t paddingSize = 0;
    memcpy(dstTarget, section->data(), bufferSize);

    if (Support::test(copyFlags, CopySectionFlags::kPadSectionBuffer) && bufferSize < section->virtualSize()) {
      paddingSize = Support::min<size_t>(dstSize - offset, size_t(section->virtualSize())) - bufferSize;
      memset(dstTarget + bufferSize, 0, paddingSize);
    }

    end = Support::max(end, offset + bufferSize + paddingSize);
  }

  if (end < dstSize && Support::test(copyFlags, CopySectionFlags::kPadTargetBuffer)) {
    memset(static_cast<uint8_t*>(dst) + end, 0, dstSize - end);
  }

  return kErrorOk;
}